

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,FnCall *node)

{
  Identifier *pIVar1;
  Expr *pEVar2;
  pointer puVar3;
  
  std::operator<<((ostream *)&std::cout,"(call ");
  pIVar1 = (node->m_ident)._M_t.
           super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
           super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
           super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl;
  (**(code **)((long)(pIVar1->super_Expr).super_Stmt + 0x10))(pIVar1,this);
  std::operator<<((ostream *)&std::cout," with args ");
  puVar3 = (node->m_args).
           super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (puVar3 != (node->m_args).
                   super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    pEVar2 = (puVar3->_M_t).super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
             super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
             super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
    (*(pEVar2->super_Stmt)._vptr_Stmt[2])(pEVar2,this);
    puVar3 = puVar3 + 1;
    if (puVar3 != (node->m_args).
                  super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)&std::cout," ");
    }
  }
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void PrettyPrinter::visit(AST::FnCall *node) {
    std::cout << "(call ";
    node->m_ident->accept(this);
    std::cout << " with args ";
    for (auto iter = node->m_args.cbegin(); iter != node->m_args.cend(); ++iter) {
        iter->get()->accept(this);
        if (iter + 1 != node->m_args.cend()) {
            std::cout << " ";
        }
    }
    std::cout << ")";
}